

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

XSAnnotation * __thiscall
xercesc_4_0::XSObjectFactory::getAnnotationFromModel
          (XSObjectFactory *this,XSModel *xsModel,void *key)

{
  BaseRefVectorOf<xercesc_4_0::XSNamespaceItem> *this_00;
  XSNamespaceItem *pXVar1;
  XSAnnotation *pXVar2;
  uint uVar3;
  
  do {
    this_00 = &xsModel->fXSNamespaceItemList->super_BaseRefVectorOf<xercesc_4_0::XSNamespaceItem>;
    for (uVar3 = 0; (ulong)uVar3 < this_00->fCurCount; uVar3 = uVar3 + 1) {
      pXVar1 = BaseRefVectorOf<xercesc_4_0::XSNamespaceItem>::elementAt(this_00,(ulong)uVar3);
      if ((pXVar1->fGrammar != (SchemaGrammar *)0x0) &&
         (pXVar2 = SchemaGrammar::getAnnotation(pXVar1->fGrammar,key), pXVar2 != (XSAnnotation *)0x0
         )) {
        return pXVar2;
      }
    }
    xsModel = xsModel->fParent;
    if (xsModel == (XSModel *)0x0) {
      return (XSAnnotation *)0x0;
    }
  } while( true );
}

Assistant:

XSAnnotation* XSObjectFactory::getAnnotationFromModel(XSModel* const xsModel,
                                               const void* const key)
{
    XSNamespaceItemList* namespaceItemList = xsModel->getNamespaceItems();

    XSAnnotation* annot = 0;
    for (unsigned int i=0; i<namespaceItemList->size(); i++)
    {
        XSNamespaceItem* nsItem = namespaceItemList->elementAt(i);
        if (nsItem->fGrammar)
        {
            annot = nsItem->fGrammar->getAnnotation(key);
            if (annot)
                return annot;
        }
    }

    if (xsModel->fParent)
        return getAnnotationFromModel(xsModel->fParent, key);
    return 0;
}